

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O3

bool __thiscall
Memory::LargeHeapBlock::TestObjectMarkedBit(LargeHeapBlock *this,void *objectAddress)

{
  undefined4 *puVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  undefined8 *in_FS_OFFSET;
  LargeObjectHeader *local_28;
  
  BVar4 = IsValidObject(this,objectAddress);
  if (BVar4 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                       ,0x32a,"(IsValidObject(objectAddress))","IsValidObject(objectAddress)");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar1 = 0;
  }
  bVar3 = GetObjectHeader(this,objectAddress,&local_28);
  if (bVar3) {
    bVar3 = HeapBlockMap64::IsMarked(&this->heapInfo->recycler->heapBlockMap,objectAddress);
    return bVar3;
  }
  return false;
}

Assistant:

bool
LargeHeapBlock::TestObjectMarkedBit(void* objectAddress)
{
    Assert(IsValidObject(objectAddress));

    LargeObjectHeader* pHeader = nullptr;

    if (GetObjectHeader(objectAddress, &pHeader))
    {
        Recycler* recycler = this->heapInfo->recycler;

        return recycler->heapBlockMap.IsMarked(objectAddress);
    }

    return FALSE;
}